

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

void si9ma::BinaryTree::iterative_pre_order(TreeNode *head)

{
  _Elt_pointer ppTVar1;
  ostream *poVar2;
  value_type in_RDI;
  stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
  s_stack;
  value_type local_78;
  _Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> local_70;
  
  if (in_RDI != (value_type)0x0) {
    local_78 = in_RDI;
    std::
    stack<si9ma::TreeNode_const*,std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>>
    ::stack<std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>,void>
              ((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                *)&local_70);
    std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::push_back
              ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)&local_70
               ,&local_78);
    while (local_70._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_70._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppTVar1 = local_70._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_70._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_70._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppTVar1 = local_70._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_78 = ppTVar1[-1];
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_78->value);
      std::operator<<(poVar2," ");
      std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::pop_back
                ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)
                 &local_70);
      if (local_78->right != (TreeNode *)0x0) {
        std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::push_back
                  ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)
                   &local_70,&local_78->right);
      }
      if (local_78->left != (TreeNode *)0x0) {
        std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::push_back
                  ((deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> *)
                   &local_70,&local_78->left);
      }
    }
    std::_Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::
    ~_Deque_base(&local_70);
  }
  return;
}

Assistant:

void BinaryTree::iterative_pre_order(const TreeNode *head) {
        if (head == nullptr)
            return;

        stack<const TreeNode *> s_stack;
        s_stack.push(head);
        while (!s_stack.empty()){
            head = s_stack.top();
            cout << head->value << " ";
            s_stack.pop();

            if (head->right != nullptr)
                s_stack.push(head->right);

            if (head->left != nullptr)
                s_stack.push(head->left);
        }
    }